

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.c
# Opt level: O1

sds sdsRemoveFreeSpace(sds s)

{
  long lVar1;
  byte bVar2;
  void *pvVar3;
  byte bVar4;
  size_t __size;
  ulong uVar5;
  sds pcVar6;
  long lVar7;
  
  bVar4 = s[-1];
  switch(bVar4 & 7) {
  case 0:
    uVar5 = (ulong)(bVar4 >> 3);
    break;
  case 1:
    uVar5 = (ulong)(byte)s[-3];
    break;
  case 2:
    uVar5 = (ulong)*(ushort *)(s + -5);
    break;
  case 3:
    uVar5 = (ulong)*(uint *)(s + -9);
    break;
  case 4:
    uVar5 = *(ulong *)(s + -0x11);
    break;
  default:
    uVar5 = 0;
  }
  bVar2 = (byte)(bVar4 & 7);
  if (bVar2 < 5) {
    lVar7 = *(long *)(&UINT_0010c0f0 + (ulong)(bVar4 & 7) * 2);
  }
  else {
    lVar7 = 0;
  }
  if (uVar5 < 0x20) {
    bVar4 = 0;
  }
  else {
    bVar4 = 1;
    if ((0xfe < uVar5) && (bVar4 = 2, 0xfffe < uVar5)) {
      bVar4 = 4 - (uVar5 < 0xffffffff);
    }
  }
  lVar1 = *(long *)(&UINT_0010c0c8 + (ulong)bVar4 * 2);
  __size = uVar5 + lVar1 + 1;
  if (bVar2 == bVar4) {
    pvVar3 = realloc(s + lVar7,__size);
    if (pvVar3 != (void *)0x0) {
      pcVar6 = (sds)((long)pvVar3 + lVar1);
      switch(pcVar6[-1] & 7) {
      case 1:
        pcVar6[-2] = (char)uVar5;
        return pcVar6;
      case 2:
        *(short *)(pcVar6 + -3) = (short)uVar5;
        return pcVar6;
      case 3:
        *(int *)(pcVar6 + -5) = (int)uVar5;
        return pcVar6;
      case 4:
        *(ulong *)(pcVar6 + -9) = uVar5;
        return pcVar6;
      default:
        return pcVar6;
      }
    }
  }
  else {
    pvVar3 = malloc(__size);
    if (pvVar3 != (void *)0x0) {
      memcpy((void *)((long)pvVar3 + lVar1),s,uVar5 + 1);
      free(s + lVar7);
      *(byte *)((long)pvVar3 + lVar1 + -1) = bVar4;
      pcVar6 = (sds)(*(code *)((long)&UINT_0010bdd0 + (long)(int)(&UINT_0010bdd0)[bVar4]))();
      return pcVar6;
    }
  }
  return (sds)0x0;
}

Assistant:

sds sdsRemoveFreeSpace(sds s) {
    void *sh, *newsh;
    char type, oldtype = s[-1] & SDS_TYPE_MASK;
    int hdrlen;
    size_t len = sdslen(s);
    sh = (char*)s-sdsHdrSize(oldtype);

    type = sdsReqType(len);
    hdrlen = sdsHdrSize(type);
    if (oldtype==type) {
        newsh = s_realloc(sh, hdrlen+len+1);
        if (newsh == NULL) return NULL;
        s = (char*)newsh+hdrlen;
    } else {
        newsh = s_malloc(hdrlen+len+1);
        if (newsh == NULL) return NULL;
        memcpy((char*)newsh+hdrlen, s, len+1);
        s_free(sh);
        s = (char*)newsh+hdrlen;
        s[-1] = type;
        sdssetlen(s, len);
    }
    sdssetalloc(s, len);
    return s;
}